

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O3

void __thiscall
LiteScript::_Type_NAMESPACE::Load
          (_Type_NAMESPACE *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  long *plVar1;
  Memory *this_00;
  char *name;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  code *pcVar7;
  long in_R8;
  char *local_88;
  undefined8 local_80;
  char local_78 [16];
  Namespace *local_68;
  Object *local_60;
  long local_58;
  Nullable<LiteScript::Variable> local_50;
  
  local_58 = in_R8;
  Object::Reassign(object,(Type *)_type_namespace,0x20);
  local_68 = (Namespace *)object->data;
  local_60 = object;
  uVar3 = std::istream::get();
  uVar4 = std::istream::get();
  uVar5 = std::istream::get();
  iVar6 = std::istream::get();
  uVar3 = iVar6 << 0x18 | (uVar5 & 0xff) << 0x10 | (uVar4 & 0xff) << 8 | uVar3 & 0xff;
  local_88 = local_78;
  local_78[0] = '\0';
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      local_80 = 0;
      *local_88 = '\0';
      while (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
        cVar2 = std::istream::get();
        if (cVar2 == '\0') break;
        std::__cxx11::string::push_back((char)&local_88);
      }
      name = local_88;
      this_00 = local_60->memory;
      plVar1 = (long *)((long)(this_00->arr)._M_elems + local_58);
      pcVar7 = (code *)caller;
      if ((caller & 1) != 0) {
        pcVar7 = *(code **)(*plVar1 + -1 + caller);
      }
      uVar5 = (*pcVar7)(plVar1,stream);
      Memory::GetVariable(&local_50,this_00,uVar5);
      Namespace::DefineVariable(local_68,name,(Variable *)&local_50);
      if (local_50.is_null == false) {
        Variable::~Variable((Variable *)&local_50);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_NAMESPACE::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::NAMESPACE, sizeof(Namespace));
    Namespace& obj = object.GetData<Namespace>();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    std::string key;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
            key += c;
        obj.DefineVariable(key.c_str(), *object.memory.GetVariable((object.memory.*caller)(stream)));
    }
}